

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O2

bool __thiscall
cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::insert
          (ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,unsigned_long *key
          ,unsigned_long value,allow a)

{
  long lVar1;
  bool bVar2;
  time_point now;
  unsigned_long local_38;
  
  local_38 = value;
  std::mutex::lock((mutex *)this);
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  lVar1 = (this->m_uniform_ttl).__r;
  do_prune(this,now);
  bVar2 = do_insert_update(this,key,&local_38,(time_point)(lVar1 * 1000000 + (long)now.__d.__r),a);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar2;
}

Assistant:

auto insert(const key_type& key, value_type value, allow a = allow::insert_or_update) -> bool
    {
        std::lock_guard guard{m_lock};
        const auto      now         = std::chrono::steady_clock::now();
        const auto      expire_time = now + m_uniform_ttl;

        do_prune(now);

        return do_insert_update(key, std::move(value), expire_time, a);
    }